

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O2

int main(void)

{
  size_t in_RSI;
  
  basic_test();
  init_test();
  set_get_max_keylen();
  config_test();
  delete_reopen_test();
  deleted_doc_get_api_test();
  deleted_doc_stat_test();
  complete_delete_test();
  set_get_meta_test();
  get_byoffset_diff_kvs_test();
  long_filename_test();
  error_to_str_test();
  seq_tree_exception_test();
  wal_commit_test();
  incomplete_block_test();
  custom_compare_primitive_test();
  custom_compare_variable_test();
  custom_compare_commit_compact(false);
  custom_compare_commit_compact(true);
  custom_seqnum_test(true);
  custom_seqnum_test(false);
  db_close_and_remove();
  db_drop_test();
  db_destroy_test();
  db_destroy_test_full_path();
  doc_compression_test();
  read_doc_by_offset_test();
  api_wrapper_test();
  flush_before_commit_test();
  flush_before_commit_multi_writers_test();
  auto_commit_test();
  auto_commit_space_used_test();
  last_wal_flush_header_test();
  long_key_test();
  multi_thread_client_shutdown((void *)0x0);
  multi_thread_kvs_client((void *)0x0);
  multi_thread_fhandle_share((void *)0x0);
  operational_stats_test(false);
  operational_stats_test(true);
  open_multi_files_kvs_test();
  rekey_test();
  invalid_get_byoffset_test();
  dirty_index_consistency_test();
  kvs_deletion_without_commit();
  purge_logically_deleted_doc_test();
  large_batch_write_no_commit_test();
  multi_thread_test(0xa000,in_RSI,0x14,1,100,2,6);
  apis_with_invalid_handles_test();
  get_nearest_test();
  get_nearest_with_deletion_test();
  bottom_up_build_test();
  return 0;
}

Assistant:

int main(){
    basic_test();
    init_test();
    set_get_max_keylen();
    config_test();
    delete_reopen_test();
    deleted_doc_get_api_test();
    deleted_doc_stat_test();
    complete_delete_test();
    set_get_meta_test();
    get_byoffset_diff_kvs_test();
#if !defined(WIN32) && !defined(_WIN32)
#ifndef _MSC_VER
    long_filename_test(); // temporarily disable until windows is fixed
#endif
#endif
    error_to_str_test();
    seq_tree_exception_test();
    wal_commit_test();
    incomplete_block_test();
    custom_compare_primitive_test();
    custom_compare_variable_test();
    custom_compare_commit_compact(false);
    custom_compare_commit_compact(true);
    custom_seqnum_test(true); // multi-kv
    custom_seqnum_test(false); // single kv mode
    db_close_and_remove();
    db_drop_test();
    db_destroy_test();
#if !defined(WIN32) && !defined(_WIN32)
#ifndef _MSC_VER
    db_destroy_test_full_path(); // only for non-windows
#endif
#endif
    doc_compression_test();
    read_doc_by_offset_test();
    api_wrapper_test();
    flush_before_commit_test();
    flush_before_commit_multi_writers_test();
    auto_commit_test();
    auto_commit_space_used_test();
    last_wal_flush_header_test();
    long_key_test();
    multi_thread_client_shutdown(NULL);
    multi_thread_kvs_client(NULL);
    multi_thread_fhandle_share(NULL);
    operational_stats_test(false);
    operational_stats_test(true);
    open_multi_files_kvs_test();
    rekey_test();
    invalid_get_byoffset_test();
    dirty_index_consistency_test();
    kvs_deletion_without_commit();
    purge_logically_deleted_doc_test();
    large_batch_write_no_commit_test();
    multi_thread_test(40*1024, 1024, 20, 1, 100, 2, 6);
    apis_with_invalid_handles_test();
    get_nearest_test();
    get_nearest_with_deletion_test();
    bottom_up_build_test();
    return 0;
}